

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity,REF_DBL *min_del,REF_DBL *min_add)

{
  int iVar1;
  int node1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT *pRVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  REF_LIST pRVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  REF_BOOL *pRVar14;
  double dVar15;
  double dVar16;
  REF_DBL quality;
  REF_DBL r1;
  REF_DBL r0;
  REF_INT nodes [27];
  double local_d0;
  REF_BOOL *local_c8;
  double local_c0;
  REF_DBL local_b8;
  REF_DBL local_b0;
  REF_INT local_a8 [3];
  int local_9c;
  
  ref_node = ref_cavity->ref_grid->node;
  ref_cell = ref_cavity->ref_grid->cell[8];
  iVar1 = ref_cavity->node;
  *min_del = -2.0;
  *min_add = -2.0;
  pRVar6 = ref_cavity->tet_list;
  if (pRVar6->n < 1) {
    uVar12 = 0;
    dVar15 = 1.0;
  }
  else {
    dVar15 = 1.0;
    uVar12 = 0;
    do {
      uVar4 = ref_cell_nodes(ref_cell,pRVar6->value[uVar12],local_a8);
      if (uVar4 != 0) {
        pcVar11 = "cell";
        uVar8 = 0x93f;
        goto LAB_001c31c5;
      }
      uVar4 = ref_node_tet_quality(ref_node,local_a8,&local_d0);
      if (uVar4 != 0) {
        pcVar11 = "new qual";
        uVar8 = 0x940;
        goto LAB_001c31c5;
      }
      uVar12 = uVar12 + 1;
      if (local_d0 <= dVar15) {
        dVar15 = local_d0;
      }
      pRVar6 = ref_cavity->tet_list;
    } while ((long)uVar12 < (long)pRVar6->n);
    if (ref_cavity->debug != 0 && (int)uVar12 != 0) {
      printf("- min %12.8f avg %12.8f n %d\n",uVar12 & 0xffffffff);
    }
  }
  pRVar14 = &ref_cavity->debug;
  *min_del = dVar15;
  iVar5 = ref_cavity->maxface;
  if (iVar5 < 1) {
    uVar10 = 0;
    dVar15 = 1.0;
  }
  else {
    lVar13 = 0;
    dVar16 = 0.0;
    dVar15 = 1.0;
    lVar9 = 0;
    uVar10 = 0;
    local_c8 = pRVar14;
    do {
      pRVar2 = ref_cavity->f2n;
      if (pRVar2[lVar9 * 3] != -1) {
        lVar7 = 0;
        bVar3 = false;
        do {
          if (iVar1 == *(int *)((long)pRVar2 + lVar7 * 4 + lVar13)) {
            bVar3 = true;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (!bVar3) {
          lVar7 = 0;
          do {
            local_a8[lVar7] = *(REF_INT *)((long)pRVar2 + lVar7 * 4 + lVar13);
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_c0 = dVar16;
          local_9c = iVar1;
          uVar4 = ref_node_tet_quality(ref_node,local_a8,&local_d0);
          if (uVar4 != 0) {
            pcVar11 = "new qual";
            uVar8 = 0x95b;
LAB_001c31c5:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar8,"ref_cavity_change",(ulong)uVar4,pcVar11);
            return uVar4;
          }
          uVar10 = (ulong)((int)uVar10 + 1);
          dVar16 = local_c0 + local_d0;
          if (local_d0 <= dVar15) {
            dVar15 = local_d0;
          }
          iVar5 = ref_cavity->maxface;
        }
      }
      pRVar14 = local_c8;
      lVar9 = lVar9 + 1;
      lVar13 = lVar13 + 0xc;
    } while (lVar9 < iVar5);
    iVar5 = *local_c8;
    if ((int)uVar10 < 1 || iVar5 == 0) goto LAB_001c30a9;
    printf("+ min %12.8f avg %12.8f n %d\n",dVar15,dVar16 / (double)(int)uVar10,uVar10);
  }
  iVar5 = *pRVar14;
LAB_001c30a9:
  *min_add = dVar15;
  if (((iVar5 != 0) &&
      (printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n",dVar15,*min_del,dVar15 - *min_del,
              uVar10,uVar12 & 0xffffffff), *pRVar14 != 0)) &&
     (iVar5 = ref_cavity->maxseg, 0 < iVar5)) {
    lVar9 = 4;
    lVar13 = 0;
    do {
      node1 = *(int *)((long)ref_cavity->s2n + lVar9 + -4);
      if ((iVar1 != node1 && node1 != -1) && (iVar1 != *(int *)((long)ref_cavity->s2n + lVar9))) {
        iVar5 = ref_cavity->surf_node;
        if (iVar5 == -1) {
          iVar5 = ref_cavity->node;
        }
        uVar4 = ref_node_ratio(ref_node,iVar5,node1,&local_b0);
        if (uVar4 != 0) {
          uVar8 = 0x974;
LAB_001c322d:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 uVar8,"ref_cavity_change",(ulong)uVar4,"ratio");
          return uVar4;
        }
        iVar5 = ref_cavity->surf_node;
        if (iVar5 == -1) {
          iVar5 = ref_cavity->node;
        }
        uVar4 = ref_node_ratio(ref_node,iVar5,*(REF_INT *)((long)ref_cavity->s2n + lVar9),&local_b8)
        ;
        if (uVar4 != 0) {
          uVar8 = 0x977;
          goto LAB_001c322d;
        }
        printf("+ ratio %f %f\n",local_b0,local_b8);
        iVar5 = ref_cavity->maxseg;
      }
      lVar13 = lVar13 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar13 < iVar5);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_change(REF_CAVITY ref_cavity, REF_DBL *min_del,
                                     REF_DBL *min_add) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_CELL ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality, total_quality;
  REF_INT face, face_node, n, n_del, n_add;
  REF_BOOL skip;

  *min_del = -2.0;
  *min_add = -2.0;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell");
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("- min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_del = min_quality;
  n_del = n;

  n = 0;
  min_quality = 1.0;
  total_quality = 0.0;
  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      nodes[face_node] = ref_cavity_f2n(ref_cavity, face_node, face);
    }
    nodes[3] = node;
    RSS(ref_node_tet_quality(ref_node, nodes, &quality), "new qual");
    n++;
    total_quality += quality;
    min_quality = MIN(min_quality, quality);
  }
  if (ref_cavity_debug(ref_cavity) && n > 0)
    printf("+ min %12.8f avg %12.8f n %d\n", min_quality,
           total_quality / ((REF_DBL)n), n);
  *min_add = min_quality;
  n_add = n;

  if (ref_cavity_debug(ref_cavity))
    printf(" min %12.8f <- %12.8f diff %12.8f n %d <- %d\n", *min_add, *min_del,
           *min_add - *min_del, n_add, n_del);

  if (ref_cavity_debug(ref_cavity)) {
    REF_INT seg;
    REF_DBL r0, r1;
    each_ref_cavity_valid_seg(ref_cavity, seg) {
      /* skip a seg attached to node */
      if (node == ref_cavity_s2n(ref_cavity, 0, seg) ||
          node == ref_cavity_s2n(ref_cavity, 1, seg))
        continue;
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 0, seg), &r0),
          "ratio");
      RSS(ref_node_ratio(ref_node, ref_cavity_seg_node(ref_cavity),
                         ref_cavity_s2n(ref_cavity, 1, seg), &r1),
          "ratio");
      printf("+ ratio %f %f\n", r0, r1);
    }
  }

  return REF_SUCCESS;
}